

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

void __thiscall
capnp::MallocMessageBuilder::MallocMessageBuilder
          (MallocMessageBuilder *this,ArrayPtr<capnp::word> firstSegment,
          AllocationStrategy allocationStrategy)

{
  size_t sVar1;
  word *pwVar2;
  Fault local_48;
  Fault f_1;
  Fault f;
  AllocationStrategy allocationStrategy_local;
  MallocMessageBuilder *this_local;
  ArrayPtr<capnp::word> firstSegment_local;
  
  firstSegment_local.ptr = (word *)firstSegment.size_;
  this_local = (MallocMessageBuilder *)firstSegment.ptr;
  MessageBuilder::MessageBuilder(&this->super_MessageBuilder);
  (this->super_MessageBuilder)._vptr_MessageBuilder =
       (_func_int **)&PTR__MallocMessageBuilder_0062fc78;
  sVar1 = kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)&this_local);
  *(int *)&(this->super_MessageBuilder).field_0xbc = (int)sVar1;
  this->allocationStrategy = allocationStrategy;
  this->ownFirstSegment = false;
  this->returnedFirstSegment = false;
  pwVar2 = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)&this_local);
  this->firstSegment = pwVar2;
  kj::Vector<void_*>::Vector(&this->moreSegments);
  sVar1 = kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)&this_local);
  if (sVar1 == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              (&f_1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
               ,0xd0,FAILED,"firstSegment.size() > 0","\"First segment size must be non-zero.\"",
               (char (*) [37])"First segment size must be non-zero.");
    kj::_::Debug::Fault::fatal(&f_1);
  }
  pwVar2 = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)&this_local);
  if (pwVar2->content == 0) {
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[30]>
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
             ,0xd4,FAILED,"*reinterpret_cast<uint64_t*>(firstSegment.begin()) == 0",
             "\"First segment must be zeroed.\"",(char (*) [30])"First segment must be zeroed.");
  kj::_::Debug::Fault::fatal(&local_48);
}

Assistant:

MallocMessageBuilder::MallocMessageBuilder(
    kj::ArrayPtr<word> firstSegment, AllocationStrategy allocationStrategy)
    : nextSize(firstSegment.size()), allocationStrategy(allocationStrategy),
      ownFirstSegment(false), returnedFirstSegment(false), firstSegment(firstSegment.begin()) {
  KJ_REQUIRE(firstSegment.size() > 0, "First segment size must be non-zero.");

  // Checking just the first word should catch most cases of failing to zero the segment.
  KJ_REQUIRE(*reinterpret_cast<uint64_t*>(firstSegment.begin()) == 0,
          "First segment must be zeroed.");
}